

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

bool vkt::SpirVAssembly::anon_unknown_5::compareFRem
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *param_4)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference this;
  BufferInterface *pBVar4;
  undefined4 extraout_var;
  const_reference this_00;
  Allocation *this_01;
  void *pvVar5;
  undefined4 extraout_var_00;
  float fVar6;
  float f1;
  float f0;
  size_t idx;
  float *outputAsFloat;
  float *expectedOutputAsFloat;
  BufferSp *expectedOutput;
  TestLog *param_3_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *expectedOutputs_local;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  *outputAllocs_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *param_0_local;
  
  sVar3 = std::
          vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
          size(outputAllocs);
  if (sVar3 == 1) {
    this = std::
           vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
           ::operator[](expectedOutputs,0);
    pBVar4 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(this);
    iVar1 = (*pBVar4->_vptr_BufferInterface[3])();
    this_00 = std::
              vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ::operator[](outputAllocs,0);
    this_01 = de::SharedPtr<vk::Allocation>::operator->(this_00);
    pvVar5 = ::vk::Allocation::getHostPtr(this_01);
    _f1 = 0;
    while( true ) {
      pBVar4 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(this);
      iVar2 = (*pBVar4->_vptr_BufferInterface[2])();
      if (CONCAT44(extraout_var_00,iVar2) >> 2 <= _f1) break;
      fVar6 = *(float *)(CONCAT44(extraout_var,iVar1) + _f1 * 4);
      fVar6 = deFloatAbs((*(float *)((long)pvVar5 + _f1 * 4) - fVar6) / fVar6);
      if (0.02 < fVar6) {
        return false;
      }
      _f1 = _f1 + 1;
    }
    param_0_local._7_1_ = true;
  }
  else {
    param_0_local._7_1_ = false;
  }
  return param_0_local._7_1_;
}

Assistant:

bool compareFRem(const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog&)
{
	if (outputAllocs.size() != 1)
		return false;

	const BufferSp& expectedOutput = expectedOutputs[0];
	const float *expectedOutputAsFloat = static_cast<const float*>(expectedOutput->data());
	const float* outputAsFloat = static_cast<const float*>(outputAllocs[0]->getHostPtr());;

	for (size_t idx = 0; idx < expectedOutput->getNumBytes() / sizeof(float); ++idx)
	{
		const float f0 = expectedOutputAsFloat[idx];
		const float f1 = outputAsFloat[idx];
		// \todo relative error needs to be fairly high because FRem may be implemented as
		// (roughly) frac(a/b)*b, so LSB errors can be magnified. But this should be fine for now.
		if (deFloatAbs((f1 - f0) / f0) > 0.02)
			return false;
	}

	return true;
}